

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::run_task(search *sch,multi_ex *ec)

{
  search_private *psVar1;
  search_metatask *psVar2;
  
  psVar1 = sch->priv;
  psVar1->num_calls_to_run = psVar1->num_calls_to_run + 1;
  psVar2 = psVar1->metatask;
  if ((psVar2 == (search_metatask *)0x0) || (psVar1->state == GET_TRUTH_STRING)) {
    psVar2 = (search_metatask *)psVar1->task;
  }
  (*psVar2->run)(sch,ec);
  return;
}

Assistant:

void run_task(search& sch, multi_ex& ec)
{
  search_private& priv = *sch.priv;
  priv.num_calls_to_run++;
  if (priv.metatask && (priv.state != GET_TRUTH_STRING))
    priv.metatask->run(sch, ec);
  else
    priv.task->run(sch, ec);
}